

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O2

Container *
Vector::factory(Registry *registry,
               list<const_Typelib::Type_*,_std::allocator<const_Typelib::Type_*>_> *on)

{
  Type *on_00;
  char cVar1;
  int iVar2;
  Category CVar3;
  undefined8 uVar4;
  Vector *this;
  runtime_error *this_00;
  BadCategory *this_01;
  allocator local_59;
  string local_58;
  string full_name;
  
  if (*(long *)(on + 0x10) != 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"expected only one template argument for std::vector")
    ;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  on_00 = *(Type **)(*(long *)on + 0x10);
  Typelib::Type::getName_abi_cxx11_();
  fullName(&full_name,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cVar1 = Typelib::Registry::has((string *)registry,SUB81(&full_name,0));
  if (cVar1 == '\0') {
    this = (Vector *)operator_new(0xa0);
    Vector(this,on_00);
    std::__cxx11::string::string((string *)&local_58,"",&local_59);
    Typelib::Registry::add((Type *)registry,(string *)this);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    uVar4 = Typelib::Registry::get((string *)registry);
    iVar2 = Typelib::Type::getCategory();
    if (iVar2 != 7) {
      this_01 = (BadCategory *)__cxa_allocate_exception(0x18);
      CVar3 = Typelib::Type::getCategory();
      Typelib::BadCategory::BadCategory(this_01,CVar3,Container);
      __cxa_throw(this_01,&Typelib::BadCategory::typeinfo,std::runtime_error::~runtime_error);
    }
    this = (Vector *)__dynamic_cast(uVar4,&Typelib::Type::typeinfo,&Typelib::Container::typeinfo,0);
    if (this == (Vector *)0x0) {
      __cxa_bad_cast();
    }
  }
  std::__cxx11::string::~string((string *)&full_name);
  return &this->super_Container;
}

Assistant:

Container const& Vector::factory(Registry& registry, std::list<Type const*> const& on)
{
    if (on.size() != 1)
        throw std::runtime_error("expected only one template argument for std::vector");

    Type const& contained_type = *on.front();
    std::string full_name = Vector::fullName(contained_type.getName());
    if (! registry.has(full_name))
    {
        Vector* new_type = new Vector(contained_type);
        registry.add(new_type);
        return *new_type;
    }

    const Type *type = registry.get(full_name);
    if (type->getCategory() != Type::Container) {
        throw BadCategory(type->getCategory(), Type::Container);
    } else {
        return dynamic_cast<Container const &>(*type);
    }
}